

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_2dVector::Unitize(ON_2dVector *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = ABS(this->x);
  dVar2 = ABS(this->y);
  dVar3 = dVar2;
  if (dVar2 <= dVar1) {
    dVar3 = dVar1;
  }
  if (dVar3 <= 2.2250738585072014e-308) {
    if (dVar3 <= 0.0) {
      dVar3 = 0.0;
    }
  }
  else {
    if (dVar2 <= dVar1) {
      dVar1 = dVar2;
    }
    dVar1 = (dVar1 / dVar3) * (dVar1 / dVar3) + 1.0;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar3 = dVar3 * dVar1;
  }
  if ((ulong)ABS(dVar3) < 0x7ff0000000000000) {
    if (2.2250738585072014e-308 < dVar3) {
      this->x = this->x / dVar3;
      this->y = this->y / dVar3;
      return true;
    }
    if (0.0 < dVar3) {
      dVar5 = this->x * 8.98846567431158e+307;
      dVar4 = this->y * 8.98846567431158e+307;
      dVar1 = ABS(dVar5);
      dVar2 = ABS(dVar4);
      dVar3 = dVar2;
      if (dVar2 <= dVar1) {
        dVar3 = dVar1;
      }
      if (dVar3 <= 2.2250738585072014e-308) {
        if (dVar3 <= 0.0) {
          dVar3 = 0.0;
        }
      }
      else {
        if (dVar2 <= dVar1) {
          dVar1 = dVar2;
        }
        dVar1 = (dVar1 / dVar3) * (dVar1 / dVar3) + 1.0;
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        dVar3 = dVar3 * dVar1;
      }
      if (2.2250738585072014e-308 < dVar3 && (ulong)ABS(dVar3) < 0x7ff0000000000000) {
        this->x = dVar5 / dVar3;
        this->y = dVar4 / dVar3;
        return true;
      }
    }
  }
  this->x = 0.0;
  this->y = 0.0;
  return false;
}

Assistant:

bool ON_2dVector::Unitize()
{
  // 15 September 2003 Dale Lear
  //     Added the ON_IS_FINITE and ON_DBL_MIN test.  See ON_2dVector::Length()
  //     for details.
  double d = Length();
  if ( ON_IS_FINITE(d) )
  {
    if ( d > ON_DBL_MIN ) 
    {
      x /= d;
      y /= d;
      return true;
    }
    
    if ( d > 0.0 )
    {
      // This code is rarely used and can be slow.
      // It multiplies by 2^1023 in an attempt to 
      // normalize the coordinates.
      // If the renormalization works, then we're
      // ok.  If the renormalization fails, we
      // return false.
      ON_2dVector tmp;
      tmp.x = x*8.9884656743115795386465259539451e+307;
      tmp.y = y*8.9884656743115795386465259539451e+307;
      d = tmp.Length();
      if ( ON_IS_FINITE(d) && d > ON_DBL_MIN )
      {
        x = tmp.x/d;
        y = tmp.y/d;
        return true;
      }
    }
  }

  x = 0.0;
  y = 0.0;

  return false;
}